

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  float t_00;
  int b;
  int g;
  int r;
  float t;
  float d;
  ImDrawVert *vert;
  ImDrawVert *vert_end;
  ImDrawVert *vert_start;
  float gradient_inv_length2;
  ImVec2 gradient_extent;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 local_5c;
  float local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  float local_34;
  ImVec2 local_30;
  uint local_28;
  uint local_24;
  int local_20;
  int local_1c;
  long local_18;
  
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_EDX;
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_30 = ::operator-(in_stack_ffffffffffffff88,(ImVec2 *)0x1e5e55);
  local_34 = ImLengthSqr(&local_30);
  local_34 = 1.0 / local_34;
  local_48 = *(long *)(local_18 + 0x28) + (long)local_20 * 0x14;
  local_50 = *(long *)(local_18 + 0x28) + (long)local_1c * 0x14;
  local_40 = local_50;
  for (; local_50 < local_48; local_50 = local_50 + 0x14) {
    local_5c = ::operator-(in_stack_ffffffffffffff88,(ImVec2 *)0x1e5ed7);
    local_54 = ImDot(&local_5c,&local_30);
    t_00 = ImClamp<float>(local_54 * local_34,0.0,1.0);
    uVar1 = ImLerp<int>(local_24 & 0xff,local_28 & 0xff,t_00);
    iVar2 = ImLerp<int>(local_24 >> 8 & 0xff,local_28 >> 8 & 0xff,t_00);
    iVar3 = ImLerp<int>(local_24 >> 0x10 & 0xff,local_28 >> 0x10 & 0xff,t_00);
    *(uint *)(local_50 + 0x10) =
         uVar1 | iVar2 << 8 | iVar3 << 0x10 | *(uint *)(local_50 + 0x10) & 0xff000000;
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearColorGradientKeepAlpha(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, ImVec2 gradient_p0, ImVec2 gradient_p1, ImU32 col0, ImU32 col1)
{
    ImVec2 gradient_extent = gradient_p1 - gradient_p0;
    float gradient_inv_length2 = 1.0f / ImLengthSqr(gradient_extent);
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    for (ImDrawVert* vert = vert_start; vert < vert_end; vert++)
    {
        float d = ImDot(vert->pos - gradient_p0, gradient_extent);
        float t = ImClamp(d * gradient_inv_length2, 0.0f, 1.0f);
        int r = ImLerp((int)(col0 >> IM_COL32_R_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_R_SHIFT) & 0xFF, t);
        int g = ImLerp((int)(col0 >> IM_COL32_G_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_G_SHIFT) & 0xFF, t);
        int b = ImLerp((int)(col0 >> IM_COL32_B_SHIFT) & 0xFF, (int)(col1 >> IM_COL32_B_SHIFT) & 0xFF, t);
        vert->col = (r << IM_COL32_R_SHIFT) | (g << IM_COL32_G_SHIFT) | (b << IM_COL32_B_SHIFT) | (vert->col & IM_COL32_A_MASK);
    }
}